

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_len(lua_State *L,int idx)

{
  int iVar1;
  StkId pTVar2;
  int *piVar3;
  TValue *rb;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x5fd,"void lua_len(lua_State *, int)");
  }
  rb = index2addr(L,idx);
  luaV_objlen(L,L->top,rb);
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  if (pTVar2 + 1 <= L->ci->top) {
    piVar3 = *(int **)&L[-1].hookmask;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      return;
    }
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x601,"void lua_len(lua_State *, int)");
  }
  __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x600,"void lua_len(lua_State *, int)");
}

Assistant:

LUA_API void lua_len (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  t = index2addr(L, idx);
  luaV_objlen(L, L->top, t);
  api_incr_top(L);
  lua_unlock(L);
}